

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_witness_stack_clone_alloc
              (wally_tx_witness_stack *stack,wally_tx_witness_stack **output)

{
  bool bVar1;
  int local_34;
  wally_tx_witness_stack *pwStack_30;
  int ret;
  size_t i;
  wally_tx_witness_stack *result;
  wally_tx_witness_stack **output_local;
  wally_tx_witness_stack *stack_local;
  
  if (output == (wally_tx_witness_stack **)0x0) {
    stack_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx_witness_stack *)0x0;
    if (stack == (wally_tx_witness_stack *)0x0) {
      stack_local._4_4_ = -2;
    }
    else {
      result = (wally_tx_witness_stack *)output;
      output_local = (wally_tx_witness_stack **)stack;
      local_34 = wally_tx_witness_stack_init_alloc
                           (stack->items_allocation_len,(wally_tx_witness_stack **)&i);
      pwStack_30 = (wally_tx_witness_stack *)0x0;
      while( true ) {
        bVar1 = false;
        if (local_34 == 0) {
          bVar1 = pwStack_30 < output_local[1];
        }
        if (!bVar1) break;
        local_34 = wally_tx_witness_stack_set
                             ((wally_tx_witness_stack *)i,(size_t)pwStack_30,
                              (uchar *)(&(*output_local)->items)[(long)pwStack_30 * 2],
                              (&(*output_local)->num_items)[(long)pwStack_30 * 2]);
        pwStack_30 = (wally_tx_witness_stack *)((long)&pwStack_30->items + 1);
      }
      if (local_34 == 0) {
        result->items = (wally_tx_witness_item *)i;
      }
      else {
        wally_tx_witness_stack_free((wally_tx_witness_stack *)i);
      }
      stack_local._4_4_ = local_34;
    }
  }
  return stack_local._4_4_;
}

Assistant:

int wally_tx_witness_stack_clone_alloc(const struct wally_tx_witness_stack *stack,
                                       struct wally_tx_witness_stack **output)
{
    struct wally_tx_witness_stack *result;
    size_t i;
    int ret;

    TX_CHECK_OUTPUT;
    if (!stack)
        return WALLY_EINVAL;

    ret = wally_tx_witness_stack_init_alloc(stack->items_allocation_len, &result);
    for (i = 0; ret == WALLY_OK && i < stack->num_items; ++i) {
        ret = wally_tx_witness_stack_set(result, i,
                                         stack->items[i].witness,
                                         stack->items[i].witness_len);
    }
    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_witness_stack_free(result);
    return ret;
}